

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O2

ValueEntry * __thiscall rsg::ValueScope::allocate(ValueScope *this,Variable *variable)

{
  ValueEntry *this_00;
  ValueEntry *entry;
  ValueEntry *local_20;
  
  this_00 = (ValueEntry *)operator_new(0x88);
  ValueEntry::ValueEntry(this_00,variable);
  local_20 = this_00;
  std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>::push_back
            (&this->m_entries,&local_20);
  return local_20;
}

Assistant:

ValueEntry* ValueScope::allocate (const Variable* variable)
{
	ValueEntry* entry = new ValueEntry(variable);
	try
	{
		m_entries.push_back(entry);
		return entry;
	}
	catch (const std::exception&)
	{
		delete entry;
		throw;
	}
}